

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChLoadsXYZnode.cpp
# Opt level: O2

void __thiscall
chrono::ChLoadXYZnodeForceAbsolute::ChLoadXYZnodeForceAbsolute
          (ChLoadXYZnodeForceAbsolute *this,shared_ptr<chrono::ChNodeXYZ> *body,
          ChVector<double> *force)

{
  __shared_ptr<chrono::ChFunction_Const,_(__gnu_cxx::_Lock_policy)2> local_40;
  __shared_ptr<chrono::ChNodeXYZ,_(__gnu_cxx::_Lock_policy)2> local_30;
  undefined8 local_20;
  
  std::__shared_ptr<chrono::ChNodeXYZ,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_30,&body->super___shared_ptr<chrono::ChNodeXYZ,_(__gnu_cxx::_Lock_policy)2>);
  ChLoadXYZnodeForce::ChLoadXYZnodeForce
            (&this->super_ChLoadXYZnodeForce,(shared_ptr<chrono::ChNodeXYZ> *)&local_30);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_30._M_refcount);
  (this->super_ChLoadXYZnodeForce).super_ChLoadCustom.super_ChLoadBase.super_ChObj._vptr_ChObj =
       (_func_int **)&PTR__ChLoadXYZnodeForceAbsolute_0116d400;
  (this->m_force_base).m_data[0] = force->m_data[0];
  (this->m_force_base).m_data[1] = force->m_data[1];
  (this->m_force_base).m_data[2] = force->m_data[2];
  (this->m_modulation).super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2> =
       (__shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>)(ZEXT816(0) << 0x20);
  this->m_scale = 1.0;
  local_20 = 0x3ff0000000000000;
  std::make_shared<chrono::ChFunction_Const,double>((double *)&local_40);
  std::__shared_ptr<chrono::ChFunction,(__gnu_cxx::_Lock_policy)2>::operator=
            ((__shared_ptr<chrono::ChFunction,(__gnu_cxx::_Lock_policy)2> *)&this->m_modulation,
             &local_40);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_40._M_refcount);
  return;
}

Assistant:

ChLoadXYZnodeForceAbsolute::ChLoadXYZnodeForceAbsolute(std::shared_ptr<ChNodeXYZ> body,
                                 const ChVector<>& force)
    : ChLoadXYZnodeForce(body),
      m_force_base(force),
      m_scale(1) {
    m_modulation = chrono_types::make_shared<ChFunction_Const>(1.0);
}